

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O0

bool __thiscall senjo::Thread::Start(Thread *this,_func_void_void_ptr *function,void *param)

{
  int iVar1;
  ostream *poVar2;
  int err;
  void *param_local;
  _func_void_void_ptr *function_local;
  Thread *this_local;
  
  if (function == (_func_void_void_ptr *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"NULL thread function");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else if ((this->running & 1U) == 0) {
    this->threadFunction = function;
    this->threadParam = param;
    iVar1 = pthread_create(&this->thread,(pthread_attr_t *)0x0,RunPThreadFunction,this);
    if (iVar1 == 0) {
      this->running = true;
      this_local._7_1_ = true;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to create thread: error code ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Thread::Start() already active");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Thread::Start(void (*function)(void*), void* param)
{
  if (!function) {
    std::cerr << "NULL thread function" << std::endl;
    return false;
  }
#ifdef _WIN32
  if (thread) {
    std::cerr << "Thread::Start() already active" << std::endl;
    return false;
  }
  threadFunction = function;
  threadParam = param;
  thread = CreateThread(NULL, 0, (LPTHREAD_START_ROUTINE)RunThreadFunction,
                        (LPVOID)this, 0, &threadID);
  if (!thread) {
    std::cerr << "Unable to create thread: error code " << GetLastError()
              << std::endl;
  }
#else
  if (running) {
    std::cerr << "Thread::Start() already active" << std::endl;
    return false;
  }
  threadFunction = function;
  threadParam = param;
  int err = pthread_create(&thread, NULL, RunPThreadFunction, this);
  if (err) {
    std::cerr << "Unable to create thread: error code " << err
              << std::endl;
    return false;
  }
  running = true;
#endif
  return true;
}